

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::
PropagateDateTruncStatistics<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::CenturyOperator>
          (duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  bool bVar1;
  date_t dVar2;
  date_t dVar3;
  reference pvVar4;
  LogicalType local_110;
  BaseStatistics result;
  Value min_value;
  Value max_value;
  
  this_00 = input->child_stats;
  pvVar4 = vector<duckdb::BaseStatistics,_true>::get<true>(this_00,1);
  bVar1 = NumericStats::HasMinMax(pvVar4);
  if (bVar1) {
    dVar2 = NumericStats::GetMin<duckdb::date_t>(pvVar4);
    dVar3 = NumericStats::GetMax<duckdb::date_t>(pvVar4);
    if (dVar2.days <= dVar3.days) {
      dVar2 = DateTrunc::
              UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::CenturyOperator>(dVar2)
      ;
      dVar3 = DateTrunc::
              UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::CenturyOperator>(dVar3)
      ;
      Value::CreateValue<duckdb::date_t>(&min_value,dVar2);
      Value::CreateValue<duckdb::date_t>(&max_value,dVar3);
      LogicalType::LogicalType(&local_110,&min_value.type_);
      NumericStats::CreateEmpty(&result,&local_110);
      LogicalType::~LogicalType(&local_110);
      NumericStats::SetMin(&result,&min_value);
      NumericStats::SetMax(&result,&max_value);
      pvVar4 = vector<duckdb::BaseStatistics,_true>::get<true>(this_00,0);
      BaseStatistics::CopyValidity(&result,pvVar4);
      BaseStatistics::ToUnique((BaseStatistics *)this);
      BaseStatistics::~BaseStatistics(&result);
      Value::~Value(&max_value);
      Value::~Value(&min_value);
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDateTruncStatistics(ClientContext &context, FunctionStatisticsInput &input) {
	return DateTruncStatistics<TA, TR, OP>(input.child_stats);
}